

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

ContinueBlockType __thiscall
diligent_spirv_cross::Compiler::continue_block_type(Compiler *this,SPIRBlock *block)

{
  uint32_t uVar1;
  Variant *pVVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  ulong uVar6;
  SPIRBlock *to;
  SPIRBlock *from;
  SPIRBlock *from_00;
  uint32_t uVar7;
  ulong uVar8;
  SPIRBlock *local_38;
  
  if (block->complex_continue == false) {
    if (block->merge == MergeLoop) {
      return WhileLoop;
    }
    uVar6 = (ulong)(block->loop_dominator).id;
    if (uVar6 != 0xffffffff) {
      to = Variant::get<diligent_spirv_cross::SPIRBlock>
                     ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr + uVar6);
      bVar3 = execution_is_noop(this,block,to);
      if (bVar3) {
        return WhileLoop;
      }
      bVar3 = execution_is_branchless(this,block,to);
      if (bVar3) {
        return ForLoop;
      }
      uVar8 = (ulong)(block->false_block).id;
      uVar6 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size;
      if ((uVar8 < uVar6) &&
         (pVVar2 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
         pVVar2[uVar8].type == TypeBlock)) {
        from = Variant::get<diligent_spirv_cross::SPIRBlock>(pVVar2 + uVar8);
        uVar6 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size;
      }
      else {
        from = (SPIRBlock *)0x0;
      }
      uVar8 = (ulong)(block->true_block).id;
      if ((uVar8 < uVar6) &&
         (pVVar2 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
         pVVar2[uVar8].type == TypeBlock)) {
        from_00 = Variant::get<diligent_spirv_cross::SPIRBlock>(pVVar2 + uVar8);
        uVar6 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size;
      }
      else {
        from_00 = (SPIRBlock *)0x0;
      }
      uVar8 = (ulong)(to->merge_block).id;
      if ((uVar8 < uVar6) &&
         (pVVar2 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
         pVVar2[uVar8].type == TypeBlock)) {
        local_38 = Variant::get<diligent_spirv_cross::SPIRBlock>(pVVar2 + uVar8);
      }
      else {
        local_38 = (SPIRBlock *)0x0;
      }
      if (from == (SPIRBlock *)0x0) {
        bVar3 = false;
      }
      else {
        bVar3 = flush_phi_required(this,(BlockID)(block->super_IVariant).self.id,
                                   (BlockID)(block->false_block).id);
      }
      if (from_00 == (SPIRBlock *)0x0) {
        bVar4 = false;
      }
      else {
        bVar4 = flush_phi_required(this,(BlockID)(block->super_IVariant).self.id,
                                   (BlockID)(block->true_block).id);
      }
      if (bVar3 != false || bVar4 != false) {
        return ComplexLoop;
      }
      uVar1 = (block->true_block).id;
      uVar5 = (block->false_block).id;
      uVar7 = (to->super_IVariant).self.id;
      if (uVar1 == uVar7) {
        uVar7 = uVar1;
        bVar3 = true;
        if (uVar5 != (to->merge_block).id) {
          bVar3 = false;
          if ((from != (SPIRBlock *)0x0) && (bVar3 = false, local_38 != (SPIRBlock *)0x0)) {
            bVar3 = execution_is_noop(this,from,local_38);
            uVar5 = (block->false_block).id;
            uVar7 = (to->super_IVariant).self.id;
          }
        }
      }
      else {
        bVar3 = false;
      }
      if (uVar5 == uVar7) {
        bVar4 = true;
        if ((block->true_block).id != (to->merge_block).id) {
          bVar4 = false;
          if ((from_00 != (SPIRBlock *)0x0) && (bVar4 = false, local_38 != (SPIRBlock *)0x0)) {
            bVar4 = execution_is_noop(this,from_00,local_38);
          }
        }
      }
      else {
        bVar4 = false;
      }
      return ComplexLoop -
             (byte)((bVar3 | bVar4) &
                   (*(int *)&(block->super_IVariant).field_0xc == 2 && block->merge == MergeNone));
    }
  }
  return ComplexLoop;
}

Assistant:

SPIRBlock::ContinueBlockType Compiler::continue_block_type(const SPIRBlock &block) const
{
	// The block was deemed too complex during code emit, pick conservative fallback paths.
	if (block.complex_continue)
		return SPIRBlock::ComplexLoop;

	// In older glslang output continue block can be equal to the loop header.
	// In this case, execution is clearly branchless, so just assume a while loop header here.
	if (block.merge == SPIRBlock::MergeLoop)
		return SPIRBlock::WhileLoop;

	if (block.loop_dominator == BlockID(SPIRBlock::NoDominator))
	{
		// Continue block is never reached from CFG.
		return SPIRBlock::ComplexLoop;
	}

	auto &dominator = get<SPIRBlock>(block.loop_dominator);

	if (execution_is_noop(block, dominator))
		return SPIRBlock::WhileLoop;
	else if (execution_is_branchless(block, dominator))
		return SPIRBlock::ForLoop;
	else
	{
		const auto *false_block = maybe_get<SPIRBlock>(block.false_block);
		const auto *true_block = maybe_get<SPIRBlock>(block.true_block);
		const auto *merge_block = maybe_get<SPIRBlock>(dominator.merge_block);

		// If we need to flush Phi in this block, we cannot have a DoWhile loop.
		bool flush_phi_to_false = false_block && flush_phi_required(block.self, block.false_block);
		bool flush_phi_to_true = true_block && flush_phi_required(block.self, block.true_block);
		if (flush_phi_to_false || flush_phi_to_true)
			return SPIRBlock::ComplexLoop;

		bool positive_do_while = block.true_block == dominator.self &&
		                         (block.false_block == dominator.merge_block ||
		                          (false_block && merge_block && execution_is_noop(*false_block, *merge_block)));

		bool negative_do_while = block.false_block == dominator.self &&
		                         (block.true_block == dominator.merge_block ||
		                          (true_block && merge_block && execution_is_noop(*true_block, *merge_block)));

		if (block.merge == SPIRBlock::MergeNone && block.terminator == SPIRBlock::Select &&
		    (positive_do_while || negative_do_while))
		{
			return SPIRBlock::DoWhileLoop;
		}
		else
			return SPIRBlock::ComplexLoop;
	}
}